

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

QPainterPath __thiscall QPainterPath::simplified(QPainterPath *this)

{
  long lVar1;
  bool bVar2;
  QPathClipper *in_RSI;
  QPainterPathPrivate *in_RDI;
  long in_FS_OFFSET;
  QPathClipper clipper;
  QExplicitlySharedDataPointer<QPainterPathPrivate> this_00;
  QPathClipper *this_01;
  Operation in_stack_ffffffffffffffd4;
  QPathClipper *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QPainterPathPrivate_*>)
       (totally_ordered_wrapper<QPainterPathPrivate_*>)in_RDI;
  this_01 = in_RSI;
  bVar2 = isEmpty(&in_RSI->subjectPath);
  if (bVar2) {
    QPainterPath((QPainterPath *)this_00.d.ptr,(QPainterPath *)in_RDI);
  }
  else {
    this_02 = (QPathClipper *)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath((QPainterPath *)0x5c0dfb);
    QPathClipper::QPathClipper(this_01,&in_RSI->subjectPath,(QPainterPath *)this_00.d.ptr);
    ~QPainterPath((QPainterPath *)0x5c0e19);
    QPathClipper::clip(this_02,in_stack_ffffffffffffffd4);
    QPathClipper::~QPathClipper((QPathClipper *)this_00.d.ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
           (QExplicitlySharedDataPointer<QPainterPathPrivate>)this_00.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QPainterPath::simplified() const
{
    if (isEmpty())
        return *this;
    QPathClipper clipper(*this, QPainterPath());
    return clipper.clip(QPathClipper::Simplify);
}